

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,string *root_class_name,FieldDescriptor *descriptor)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  string *root_class_name_local;
  ExtensionGenerator *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)root_class_name;
  root_class_name_local = &this->method_name_;
  ExtensionMethodName_abi_cxx11_(&this->method_name_,(objectivec *)descriptor,descriptor);
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 descriptor_local,"_");
  std::operator+(&this->root_class_and_method_name_,&local_40,&this->method_name_);
  std::__cxx11::string::~string((string *)&local_40);
  this->descriptor_ = local_20;
  bVar1 = FieldDescriptor::is_map(local_20);
  if (!bVar1) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"error: Extension is a map<>!");
  poVar2 = std::operator<<(poVar2," That used to be blocked by the compiler.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  abort();
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const std::string& root_class_name,
                                       const FieldDescriptor* descriptor)
    : method_name_(ExtensionMethodName(descriptor)),
      root_class_and_method_name_(root_class_name + "_" + method_name_),
      descriptor_(descriptor) {
  if (descriptor->is_map()) {
    // NOTE: src/google/protobuf/compiler/plugin.cc makes use of cerr for some
    // error cases, so it seems to be ok to use as a back door for errors.
    std::cerr << "error: Extension is a map<>!"
         << " That used to be blocked by the compiler." << std::endl;
    std::cerr.flush();
    abort();
  }
}